

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::forthscriptcpp_reset(Forth *this)

{
  CAddr CVar1;
  pointer puVar2;
  SCell *pSVar3;
  long lVar4;
  uint uVar5;
  Cell i;
  int iVar6;
  Cell i_1;
  int iVar7;
  
  lVar4 = std::chrono::_V2::system_clock::now();
  (this->executionStarted).__r = lVar4 / 1000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&(this->dStack).stack,this->FORTHSCRIPTCPP_DSTACK_COUNT);
  iVar6 = 0;
  (this->dStack).top = 0;
  puVar2 = (this->dStack).stack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  memset(puVar2,0,(long)(this->dStack).stack.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&(this->rStack).stack,this->FORTHSCRIPTCPP_RSTACK_COUNT);
  (this->rStack).top = 0;
  puVar2 = (this->rStack).stack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  memset(puVar2,0,(long)(this->rStack).stack.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&(this->returnStack).stack,0x1000);
  virtualMemoryInit(this);
  this->sourceid = 0;
  CVar1 = this->VarOffsetNumericBase;
  iVar7 = 10;
  do {
    dataSpaceSet(this,CVar1 + iVar6,(Char)iVar7);
    iVar6 = iVar6 + 1;
    iVar7 = 0;
  } while (iVar6 != 4);
  uVar5 = this->False;
  CVar1 = this->VarOffsetState;
  do {
    dataSpaceSet(this,CVar1 + iVar7,(Char)uVar5);
    uVar5 = uVar5 >> 8;
    iVar7 = iVar7 + 1;
  } while (iVar7 != 4);
  CVar1 = this->VarOffsetBlkAddress;
  iVar6 = 0;
  do {
    dataSpaceSet(this,CVar1 + iVar6,'\0');
    iVar6 = iVar6 + 1;
  } while (iVar6 != 4);
  this->searchOrderCurrent = this->widForthWordList;
  this->searchOrderLast = this->widForthAssembler;
  std::vector<int,_std::allocator<int>_>::resize(&this->searchOrder,2);
  pSVar3 = (this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *pSVar3 = this->widForthWordList;
  pSVar3[1] = this->widForthWordList;
  initializeDefinitions(this);
  return;
}

Assistant:

void forthscriptcpp_reset() {
			executionStarted = std::chrono::duration_cast< std::chrono::milliseconds >(
				std::chrono::system_clock::now().time_since_epoch() );
			dStack.resize(FORTHSCRIPTCPP_DSTACK_COUNT);
			dStack.resetStack();
			rStack.resize(FORTHSCRIPTCPP_RSTACK_COUNT);
			rStack.resetStack();
			// return stack init;
			returnStack.resize(4096);

			virtualMemoryInit();
			
			setSourceId(0); // SOURCE-ID=0: user input 
			setNumericBase(10); // BASE = 10
			setIsCompiling(False);
			setDataCell(VarOffsetBlkAddress, Cell(0)); // set BLK=0
			
			// search order setup
			searchOrderCurrent=widForthWordList;
			searchOrderLast=widForthAssembler;
			searchOrder.resize(2);
			searchOrder[0]=widForthWordList;
			searchOrder[1]=widForthWordList;
			initializeDefinitions();
		}